

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O2

void __thiscall AsyncRgbLedAnalyzer::SetupResults(AsyncRgbLedAnalyzer *this)

{
  AsyncRgbLedAnalyzerResults *pAVar1;
  AsyncRgbLedAnalyzerResults *this_00;
  
  this_00 = (AsyncRgbLedAnalyzerResults *)operator_new(0x20);
  AsyncRgbLedAnalyzerResults::AsyncRgbLedAnalyzerResults
            (this_00,this,
             (this->mSettings)._M_t.
             super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
             ._M_t.
             super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
             .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl);
  pAVar1 = (this->mResults)._M_t.
           super___uniq_ptr_impl<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
           ._M_t.
           super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerResults_*,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
           .super__Head_base<0UL,_AsyncRgbLedAnalyzerResults_*,_false>._M_head_impl;
  (this->mResults)._M_t.
  super___uniq_ptr_impl<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
  ._M_t.
  super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerResults_*,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
  .super__Head_base<0UL,_AsyncRgbLedAnalyzerResults_*,_false>._M_head_impl = this_00;
  if (pAVar1 != (AsyncRgbLedAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pAVar1 + 8))();
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn
            ((Channel *)
             (this->mResults)._M_t.
             super___uniq_ptr_impl<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
             ._M_t.
             super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerResults_*,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
             .super__Head_base<0UL,_AsyncRgbLedAnalyzerResults_*,_false>._M_head_impl);
  return;
}

Assistant:

void AsyncRgbLedAnalyzer::SetupResults()
{
    mResults.reset( new AsyncRgbLedAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}